

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O2

Chunk * __thiscall
BlockingQueue<OrderedOutput::Chunk_*>::pop(BlockingQueue<OrderedOutput::Chunk_*> *this)

{
  _Elt_pointer pIVar1;
  Chunk *pCVar2;
  ulong uVar3;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex);
  std::condition_variable::wait<BlockingQueue<OrderedOutput::Chunk*>::pop()::_lambda()_1_>
            (&this->itemsNotEmpty,&lock,(anon_class_8_1_8991fb9c)this);
  pIVar1 = (this->items).c.
           super__Deque_base<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pCVar2 = pIVar1->value;
  uVar3 = pIVar1->size;
  std::
  deque<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
  ::pop_front(&(this->items).c);
  if (uVar3 != 0) {
    if (this->totalSize < uVar3) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<OrderedOutput::Chunk *>::pop() [T = OrderedOutput::Chunk *]");
    }
    this->totalSize = this->totalSize - uVar3;
    std::unique_lock<std::mutex>::unlock(&lock);
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return pCVar2;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}